

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  cmValue input;
  ostream *poVar2;
  string *psVar3;
  size_type sVar4;
  pointer pcVar5;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"EXPORT_NAME","");
  input = GetProperty(this,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if ((input.Value == (string *)0x0) || ((input.Value)->_M_string_length == 0)) {
    psVar3 = cmTarget::GetName_abi_cxx11_(this->Target);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = (psVar3->_M_dataplus)._M_p;
    sVar4 = psVar3->_M_string_length;
  }
  else {
    bVar1 = cmGeneratorExpression::IsValidTargetName(input.Value);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"EXPORT_NAME property \"",0x16);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,((input.Value)->_M_dataplus)._M_p,
                          (input.Value)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" for \"",7);
      psVar3 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": is not valid.",0x10);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = ((input.Value)->_M_dataplus)._M_p;
    sVar4 = (input.Value)->_M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar5,pcVar5 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  cmValue exportName = this->GetProperty("EXPORT_NAME");

  if (cmNonempty(exportName)) {
    if (!cmGeneratorExpression::IsValidTargetName(*exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << *exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str());
      return "";
    }
    return *exportName;
  }
  return this->GetName();
}